

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void initializeLibxml2(void)

{
  _xmlFree = 0;
  _xmlMalloc = 0;
  _xmlRealloc = 0;
  _xmlMemStrdup = 0;
  xmlInitParser();
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  setenv("XML_CATALOG_FILES","",1);
  xmlInitializeCatalog();
  xmlSchemaInitTypes();
  xmlRelaxNGInitTypes();
  return;
}

Assistant:

static void
initializeLibxml2(void) {
    /*
     * This verifies that xmlInitParser doesn't allocate memory with
     * xmlMalloc
     */
    xmlFree = NULL;
    xmlMalloc = NULL;
    xmlRealloc = NULL;
    xmlMemStrdup = NULL;
    xmlInitParser();
    xmlMemSetup(xmlMemFree, xmlMemMalloc, xmlMemRealloc, xmlMemoryStrdup);
#ifdef LIBXML_CATALOG_ENABLED
    /*
     * Disable system catalog which could cause lazy memory allocations
     * resulting in false positive memory leaks.
     */
#ifdef _WIN32
    putenv("XML_CATALOG_FILES=");
#else
    setenv("XML_CATALOG_FILES", "", 1);
#endif
    xmlInitializeCatalog();
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    xmlSchemaInitTypes();
    xmlRelaxNGInitTypes();
#endif
}